

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O1

void glu::drawFromBuffers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  int *__v;
  _Base_ptr p_Var1;
  VertexComponentType VVar2;
  int iVar3;
  VertexComponentConversion VVar4;
  IndexType IVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  out;
  int iVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  VertexAttributeDescriptor *__cur;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar14;
  undefined4 extraout_var_01;
  _Base_ptr p_Var15;
  TestError *pTVar16;
  ulong uVar17;
  pointer pVVar18;
  pointer pVVar19;
  undefined8 *puVar20;
  pointer pVVar21;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar22;
  _Base_ptr p_Var23;
  pointer pVVar24;
  GLenum GVar25;
  long lVar26;
  size_type sVar27;
  ulong uVar28;
  pointer pVVar29;
  PrimitiveList *pPVar30;
  GLenum GVar31;
  undefined1 *puVar32;
  _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  *this;
  char *pcVar33;
  uint uVar34;
  ulong uVar35;
  int iVar36;
  VertexArrayBinding *pVVar37;
  VertexArrayPointer *pVVar38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> localBuf;
  VertexBuffer vertexBuffer;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> bindingsWithLocations;
  vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_> srcPtrs;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  *in_stack_fffffffffffffe98;
  _Iter in_stack_fffffffffffffea0;
  pointer pVVar39;
  pointer local_148;
  allocator_type local_139;
  VertexArrayBinding *local_138;
  RenderContext *local_130;
  Functions *local_128;
  pointer local_120;
  VertexArrayBinding *local_118;
  undefined1 local_110 [32];
  _Base_ptr local_f0;
  size_t local_e8;
  PrimitiveList *local_e0;
  undefined1 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  size_t local_c0;
  int local_b4;
  VertexBuffer local_b0;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_78;
  undefined1 local_60 [16];
  undefined8 *local_50;
  long local_48;
  long local_40;
  char *local_38;
  Functions *gl;
  
  local_130 = context;
  local_e0 = primitives;
  iVar11 = (*context->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar11);
  local_78.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_78.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (VertexArrayBinding *)0x0;
  local_78.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.iter._M_current = in_stack_fffffffffffffea0._M_current;
  out.container = in_stack_fffffffffffffe98;
  (anonymous_namespace)::
  namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
            ((_anonymous_namespace_ *)gl,(Functions *)(ulong)program,(deUint32)vertexArrays,
             vertexArrays + numVertexArrays,(VertexArrayBinding *)&local_78,out);
  bVar10 = (anonymous_namespace)::
           areVertexArrayLocationsValid<__gnu_cxx::__normal_iterator<glu::VertexArrayBinding*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
                     ((__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                       )local_78.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                      (__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                       )local_78.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  if (!bVar10) {
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar16,(char *)0x0,
               "areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end())"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
               ,0x21a);
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar26 = (long)local_78.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_78.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pVVar37 = (VertexArrayBinding *)0x0;
  if (lVar26 != 0) {
    pVVar37 = local_78.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  iVar11 = (*local_130->_vptr_RenderContext[3])();
  pOVar14 = objectTraits(OBJECTTYPE_BUFFER);
  ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&local_b0,(Functions *)CONCAT44(extraout_var_00,iVar11),pOVar14);
  local_b0.m_layout.buffer = 0;
  local_b0.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar11 = (*local_130->_vptr_RenderContext[3])();
  local_40 = CONCAT44(extraout_var_01,iVar11);
  local_60._0_8_ = (lVar26 >> 4) * -0x3333333333333333;
  iVar11 = (int)local_60._0_8_;
  pcVar33 = (char *)(long)iVar11;
  local_118 = pVVar37 + (long)pcVar33;
  p_Var1 = (_Base_ptr)(local_110 + 8);
  local_110._8_4_ = _S_red;
  local_110._16_8_ = (_Base_ptr)0x0;
  local_e8 = 0;
  bVar10 = iVar11 == 0;
  local_138 = pVVar37;
  local_110._24_8_ = p_Var1;
  local_f0 = p_Var1;
  if (bVar10) {
LAB_009b6dfc:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_110);
    if (bVar10) {
      uVar35 = 0;
      sVar27 = local_60._0_8_;
      local_128 = gl;
      local_38 = pcVar33;
      if ((int)local_60._0_8_ == 0) {
        local_148 = (pointer)0x0;
        pVVar39 = (pointer)0x0;
        pVVar18 = (pointer)0x0;
      }
      else {
        pVVar18 = (pointer)0x0;
        pVVar39 = (pointer)0x0;
        local_148 = (pointer)0x0;
        pVVar37 = local_138;
        do {
          VVar2 = (pVVar37->pointer).componentType;
          uVar28 = (ulong)VVar2;
          iVar11 = 0;
          if (uVar28 < 9) {
            iVar11 = *(int *)(&DAT_00b8bc54 + uVar28 * 4);
          }
          uVar34 = (int)uVar35 + 3;
          uVar22 = uVar34 & 0xfffffffc;
          iVar13 = (pVVar37->pointer).numComponents;
          iVar3 = (pVVar37->pointer).numElements;
          iVar36 = (pVVar37->binding).location;
          VVar4 = (pVVar37->pointer).convert;
          puVar32 = (undefined1 *)(long)(int)uVar22;
          if (local_148 == pVVar39) {
            local_c8 = (undefined1 *)(CONCAT44(local_c8._4_4_,uVar34) & 0xfffffffffffffffc);
            local_c0 = CONCAT44(local_c0._4_4_,iVar11);
            lVar26 = (long)local_148 - (long)pVVar18;
            local_d8 = puVar32;
            local_d0 = (undefined8 *)uVar28;
            local_b4 = iVar36;
            if (lVar26 == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar17 = lVar26 >> 5;
            uVar35 = uVar17;
            if (local_148 == pVVar18) {
              uVar35 = 1;
            }
            this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                    *)(uVar35 + uVar17);
            if ((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 *)0x3fffffffffffffe < this) {
              this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                      *)0x3ffffffffffffff;
            }
            if (CARRY8(uVar35,uVar17)) {
              this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                      *)0x3ffffffffffffff;
            }
            local_120 = pVVar18;
            pVVar18 = std::
                      _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                      ::_M_allocate(this,uVar28);
            *(int *)((long)pVVar18 + lVar26) = local_b4;
            *(int *)((long)pVVar18 + lVar26 + 4) = (int)local_d0;
            *(VertexComponentConversion *)((long)pVVar18 + lVar26 + 8) = VVar4;
            *(int *)((long)pVVar18 + lVar26 + 0xc) = iVar13;
            *(int *)((long)pVVar18 + lVar26 + 0x10) = iVar3;
            *(undefined4 *)((long)pVVar18 + lVar26 + 0x14) = 0;
            *(undefined1 **)((long)pVVar18 + lVar26 + 0x18) = local_d8;
            pVVar24 = pVVar18;
            for (pVVar19 = local_120; local_148 != pVVar19; pVVar19 = pVVar19 + 1) {
              iVar36 = pVVar19->location;
              VVar2 = pVVar19->componentType;
              VVar4 = pVVar19->convert;
              iVar9 = pVVar19->numComponents;
              iVar11 = pVVar19->stride;
              pvVar6 = pVVar19->pointer;
              pVVar24->numElements = pVVar19->numElements;
              pVVar24->stride = iVar11;
              pVVar24->pointer = pvVar6;
              pVVar24->location = iVar36;
              pVVar24->componentType = VVar2;
              pVVar24->convert = VVar4;
              pVVar24->numComponents = iVar9;
              pVVar24 = pVVar24 + 1;
            }
            if (local_120 != (pointer)0x0) {
              operator_delete(local_120,(long)pVVar39 - (long)local_120);
            }
            pVVar39 = pVVar18 + (long)this;
            sVar27 = local_60._0_8_;
            gl = local_128;
            iVar11 = (int)local_c0;
            uVar22 = (uint)local_c8;
          }
          else {
            local_148->location = iVar36;
            local_148->componentType = VVar2;
            local_148->convert = VVar4;
            local_148->numComponents = iVar13;
            local_148->numElements = iVar3;
            local_148->stride = 0;
            local_148->pointer = puVar32;
            pVVar24 = local_148;
          }
          local_148 = pVVar24 + 1;
          uVar22 = iVar13 * iVar11 * iVar3 + uVar22;
          uVar35 = (ulong)uVar22;
          pVVar37 = pVVar37 + 1;
        } while (pVVar37 != local_118);
        uVar35 = (ulong)(int)uVar22;
      }
      pPVar30 = local_e0;
      pVVar37 = local_138;
      pcVar33 = local_38;
      std::vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>::vector
                ((vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_> *)
                 (local_60 + 8),(size_type)local_38,(allocator_type *)local_110);
      dVar12 = local_b0.super_Buffer.super_ObjectWrapper.m_object;
      if (0 < (int)(uint)sVar27) {
        uVar28 = (ulong)((uint)sVar27 & 0x7fffffff);
        pVVar38 = &pVVar37->pointer;
        puVar20 = (undefined8 *)local_60._8_8_;
        do {
          uVar7 = *(undefined8 *)pVVar38;
          uVar8 = *(undefined8 *)&pVVar38->numComponents;
          pvVar6 = pVVar38->data;
          puVar20[2] = *(undefined8 *)&pVVar38->stride;
          puVar20[3] = pvVar6;
          *puVar20 = uVar7;
          puVar20[1] = uVar8;
          puVar20 = puVar20 + 4;
          pVVar38 = (VertexArrayPointer *)((long)(pVVar38 + 2) + 0x10);
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      local_d0 = (undefined8 *)local_60._8_8_;
      if ((undefined8 *)local_60._8_8_ != local_50) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,uVar35,
                   &local_139);
        iVar11 = (int)((ulong)((long)local_148 - (long)pVVar18) >> 5);
        if (0 < iVar11) {
          local_d8 = &DAT_00000001;
          if (1 < (long)iVar11) {
            local_d8 = (undefined1 *)(long)iVar11;
          }
          puVar32 = (undefined1 *)0x0;
          local_120 = pVVar18;
          do {
            puVar20 = local_d0;
            pVVar18 = local_120;
            iVar11 = 0;
            if ((ulong)local_120[(long)puVar32].componentType < 9) {
              iVar11 = *(int *)(&DAT_00b8bc54 + (ulong)local_120[(long)puVar32].componentType * 4);
            }
            iVar13 = local_120[(long)puVar32].stride;
            iVar11 = iVar11 * local_120[(long)puVar32].numComponents;
            iVar3 = *(int *)(local_d0 + (long)puVar32 * 4 + 2);
            local_c8 = puVar32;
            if ((iVar3 == 0 || iVar3 == iVar11) && (iVar13 == 0 || iVar13 == iVar11)) {
              memcpy((pointer)(local_110._0_8_ + (long)local_120[(long)puVar32].pointer),
                     (void *)local_d0[(long)puVar32 * 4 + 3],
                     (long)(iVar11 * local_120[(long)puVar32].numElements));
            }
            else {
              if (iVar13 == 0) {
                iVar13 = iVar11;
              }
              if (iVar3 == 0) {
                iVar3 = iVar11;
              }
              if (0 < local_120[(long)puVar32].numElements) {
                local_c0 = (size_t)iVar11;
                iVar11 = 0;
                iVar36 = 0;
                lVar26 = 0;
                local_118 = (VertexArrayBinding *)local_110._0_8_;
                do {
                  memcpy((void *)((long)pVVar18[(long)puVar32].pointer + (long)local_118 +
                                 (long)iVar11),
                         (void *)(puVar20[(long)puVar32 * 4 + 3] + (long)iVar36),local_c0);
                  lVar26 = lVar26 + 1;
                  iVar36 = iVar36 + iVar3;
                  iVar11 = iVar11 + iVar13;
                } while (lVar26 < pVVar18[(long)puVar32].numElements);
              }
            }
            puVar32 = local_c8 + 1;
            pVVar18 = local_120;
          } while (puVar32 != local_d8);
        }
        lVar26 = local_40;
        (**(code **)(local_40 + 0x40))(0x8892,dVar12);
        gl = local_128;
        (**(code **)(lVar26 + 0x150))
                  (0x8892,(long)(local_110._8_4_ - (int)local_110._0_8_),local_110._0_8_,0x88e4);
        (**(code **)(lVar26 + 0x40))(0x8892,0);
        dVar12 = (**(code **)(lVar26 + 0x800))();
        pcVar33 = "Uploading buffer data failed";
        checkError(dVar12,"Uploading buffer data failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
                   ,0x14e);
        pPVar30 = local_e0;
        if ((VertexArrayBinding *)local_110._0_8_ != (VertexArrayBinding *)0x0) {
          pcVar33 = (char *)(local_110._16_8_ - local_110._0_8_);
          operator_delete((void *)local_110._0_8_,(ulong)pcVar33);
        }
      }
      local_b0.m_layout.buffer = local_b0.super_Buffer.super_ObjectWrapper.m_object;
      uVar35 = (long)local_148 - (long)pVVar18;
      if ((ulong)((long)local_b0.m_layout.attributes.
                        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)local_b0.m_layout.attributes.
                       super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                       ._M_impl.super__Vector_impl_data._M_start) < uVar35) {
        pVVar21 = std::
                  _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                  ::_M_allocate((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                 *)((long)uVar35 >> 5),(size_t)pcVar33);
        pVVar24 = pVVar21;
        for (pVVar19 = pVVar18; pVVar19 != local_148; pVVar19 = pVVar19 + 1) {
          iVar13 = pVVar19->location;
          VVar2 = pVVar19->componentType;
          VVar4 = pVVar19->convert;
          iVar3 = pVVar19->numComponents;
          iVar11 = pVVar19->stride;
          pvVar6 = pVVar19->pointer;
          pVVar24->numElements = pVVar19->numElements;
          pVVar24->stride = iVar11;
          pVVar24->pointer = pvVar6;
          pVVar24->location = iVar13;
          pVVar24->componentType = VVar2;
          pVVar24->convert = VVar4;
          pVVar24->numComponents = iVar3;
          pVVar24 = pVVar24 + 1;
        }
        if (local_b0.m_layout.attributes.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0.m_layout.attributes.
                          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b0.m_layout.attributes.
                                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b0.m_layout.attributes.
                                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_b0.m_layout.attributes.
        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pVVar21 + uVar35);
        gl = local_128;
        local_b0.m_layout.attributes.
        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_start = pVVar21;
      }
      else if ((ulong)((long)local_b0.m_layout.attributes.
                             super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b0.m_layout.attributes.
                            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                            ._M_impl.super__Vector_impl_data._M_start) < uVar35) {
        if (local_b0.m_layout.attributes.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_b0.m_layout.attributes.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          memmove(local_b0.m_layout.attributes.
                  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start,pVVar18,
                  (long)local_b0.m_layout.attributes.
                        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_b0.m_layout.attributes.
                        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        }
        for (pVVar24 = (pointer)(((long)local_b0.m_layout.attributes.
                                        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b0.m_layout.attributes.
                                       super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                       ._M_impl.super__Vector_impl_data._M_start) + (long)pVVar18);
            pVVar24 != local_148; pVVar24 = pVVar24 + 1) {
          iVar13 = pVVar24->location;
          VVar2 = pVVar24->componentType;
          VVar4 = pVVar24->convert;
          iVar3 = pVVar24->numComponents;
          iVar11 = pVVar24->stride;
          pvVar6 = pVVar24->pointer;
          (local_b0.m_layout.attributes.
           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish)->numElements = pVVar24->numElements;
          (local_b0.m_layout.attributes.
           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish)->stride = iVar11;
          (local_b0.m_layout.attributes.
           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pointer = pvVar6;
          (local_b0.m_layout.attributes.
           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish)->location = iVar13;
          (local_b0.m_layout.attributes.
           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish)->componentType = VVar2;
          (local_b0.m_layout.attributes.
           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish)->convert = VVar4;
          (local_b0.m_layout.attributes.
           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish)->numComponents = iVar3;
          local_b0.m_layout.attributes.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_b0.m_layout.attributes.
               super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else if (local_148 != pVVar18) {
        memmove(local_b0.m_layout.attributes.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_start,pVVar18,uVar35);
      }
      local_b0.m_layout.attributes.
      super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(uVar35 + (long)local_b0.m_layout.attributes.
                                    super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      if ((undefined8 *)local_60._8_8_ != (undefined8 *)0x0) {
        operator_delete((void *)local_60._8_8_,local_48 - local_60._8_8_);
      }
      if (pVVar18 != (pointer)0x0) {
        operator_delete(pVVar18,(long)pVVar39 - (long)pVVar18);
      }
      (*gl->bindBuffer)(0x8892,local_b0.m_layout.buffer);
      for (pVVar18 = local_b0.m_layout.attributes.
                     super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pVVar18 !=
          local_b0.m_layout.attributes.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_finish; pVVar18 = pVVar18 + 1) {
        anon_unknown_4::setVertexAttribPointer(gl,pVVar18);
      }
      (*gl->bindBuffer)(0x8892,0);
      pvVar6 = pPVar30->indices;
      if (pvVar6 == (void *)0x0) {
        if (callback != (DrawUtilCallback *)0x0) {
          (**callback->_vptr_DrawUtilCallback)();
        }
        GVar31 = 0;
        if ((ulong)pPVar30->type < 8) {
          GVar31 = *(GLenum *)(&DAT_00b8bc84 + (ulong)pPVar30->type * 4);
        }
        (*gl->drawArrays)(GVar31,0,pPVar30->numElements);
        if (callback != (DrawUtilCallback *)0x0) {
          (*callback->_vptr_DrawUtilCallback[1])();
        }
      }
      else {
        iVar11 = pPVar30->numElements;
        IVar5 = pPVar30->indexType;
        iVar13 = (*local_130->_vptr_RenderContext[3])();
        pOVar14 = objectTraits(OBJECTTYPE_BUFFER);
        ObjectWrapper::ObjectWrapper
                  ((ObjectWrapper *)local_110,(Functions *)CONCAT44(extraout_var_02,iVar13),pOVar14)
        ;
        iVar13 = (*local_130->_vptr_RenderContext[3])();
        lVar26 = CONCAT44(extraout_var_03,iVar13);
        (**(code **)(lVar26 + 0x40))(0x8893,local_110._16_8_ & 0xffffffff);
        iVar13 = 0;
        if (IVar5 < INDEXTYPE_LAST) {
          iVar13 = *(int *)(&DAT_00b8bc78 + (ulong)IVar5 * 4);
        }
        (**(code **)(lVar26 + 0x150))(0x8893,(long)(iVar13 * iVar11),pvVar6,0x88e4);
        (**(code **)(lVar26 + 0x40))(0x8893,0);
        dVar12 = (**(code **)(lVar26 + 0x800))();
        checkError(dVar12,"Uploading index data failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
                   ,0x17e);
        gl = local_128;
        (*local_128->bindBuffer)(0x8893,local_110._16_4_);
        if (callback != (DrawUtilCallback *)0x0) {
          (**callback->_vptr_DrawUtilCallback)();
        }
        GVar31 = 0;
        if ((ulong)pPVar30->type < 8) {
          GVar31 = *(GLenum *)(&DAT_00b8bc84 + (ulong)pPVar30->type * 4);
        }
        GVar25 = pPVar30->indexType * 2 + 0x1401;
        if (INDEXTYPE_UINT32 < pPVar30->indexType) {
          GVar25 = 0;
        }
        (*gl->drawElements)(GVar31,pPVar30->numElements,GVar25,(void *)0x0);
        if (callback != (DrawUtilCallback *)0x0) {
          (*callback->_vptr_DrawUtilCallback[1])();
        }
        (*gl->bindBuffer)(0x8893,0);
        ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_110);
      }
      anon_unknown_4::VertexBuffer::~VertexBuffer(&local_b0);
      for (pVVar29 = local_78.
                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pVVar29 !=
          local_78.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_finish; pVVar29 = pVVar29 + 1) {
        (*gl->disableVertexAttribArray)((pVVar29->binding).location);
      }
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                (&local_78);
      return;
    }
  }
  else {
    if ((pVVar37->binding).type == TYPE_LOCATION) {
      do {
        __v = &(pVVar37->binding).location;
        p_Var15 = p_Var1;
        if ((_Base_ptr)local_110._16_8_ != (_Base_ptr)0x0) {
          p_Var23 = (_Base_ptr)local_110._16_8_;
          do {
            if (*__v <= (int)p_Var23[1]._M_color) {
              p_Var15 = p_Var23;
            }
            p_Var23 = (&p_Var23->_M_left)[(int)p_Var23[1]._M_color < *__v];
          } while (p_Var23 != (_Base_ptr)0x0);
        }
        p_Var23 = p_Var1;
        if ((p_Var15 != p_Var1) && (p_Var23 = p_Var15, *__v < (int)p_Var15[1]._M_color)) {
          p_Var23 = p_Var1;
        }
        if (p_Var23 != p_Var1) break;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_110,__v);
        pVVar37 = pVVar37 + 1;
        bVar10 = pVVar37 == local_118;
        if (bVar10) goto LAB_009b6dfc;
      } while ((pVVar37->binding).type == TYPE_LOCATION);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_110);
  }
  pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
  local_110._0_8_ = local_110 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"Invalid vertex array locations","");
  tcu::TestError::TestError(pTVar16,(string *)local_110);
  __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void drawFromBuffers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&				gl		= context.getFunctions();
	std::vector<VertexArrayBinding>		bindingsWithLocations;

	DE_ASSERT(isDrawCallValid(numVertexArrays, vertexArrays, primitives));
	DE_ASSERT(isProgramActive(context, program));

	// Lower bindings to locations.
	namedBindingsToProgramLocations(gl, program, vertexArrays, vertexArrays+numVertexArrays, std::inserter(bindingsWithLocations, bindingsWithLocations.begin()));

	TCU_CHECK(areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end()));

	// Create buffers for duration of draw call.
	{
		VertexBuffer vertexBuffer (context, (int)bindingsWithLocations.size(), (bindingsWithLocations.empty()) ? (DE_NULL) : (&bindingsWithLocations[0]));

		// Set state.
		setVertexBufferAttributes(gl, vertexBuffer.getDescriptor());

		if (primitives.indices)
		{
			IndexBuffer indexBuffer(context, primitives.indexType, primitives.numElements, primitives.indices);

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);

			if (callback)
				callback->beforeDrawCall();

			drawIndexed(gl, primitives.type, primitives.numElements, primitives.indexType, 0);

			if (callback)
				callback->afterDrawCall();

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		else
		{
			if (callback)
				callback->beforeDrawCall();

			drawNonIndexed(gl, primitives.type, primitives.numElements);

			if (callback)
				callback->afterDrawCall();
		}
	}

	// Disable attribute arrays or otherwise someone later on might get crash thanks to invalid pointers.
	for (std::vector<VertexArrayBinding>::const_iterator vaIter = bindingsWithLocations.begin(); vaIter != bindingsWithLocations.end(); ++vaIter)
		gl.disableVertexAttribArray(vaIter->binding.location);
}